

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

int32_t __thiscall icu_63::UnicodeString::indexOf(UnicodeString *this,char16_t c,int32_t start)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int local_1c;
  
  local_1c = start;
  pinIndex(this,&local_1c);
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar2 = doIndexOf(this,c,local_1c,iVar3 - local_1c);
  return iVar2;
}

Assistant:

inline int32_t
UnicodeString::indexOf(char16_t c,
               int32_t start) const {
  pinIndex(start);
  return doIndexOf(c, start, length() - start);
}